

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void lua_sethook(lua_State *L,lua_Hook func,int mask,int count)

{
  global_State *G;
  int count_local;
  int mask_local;
  lua_Hook func_local;
  lua_State *L_local;
  
  if ((L->hook == (lua_Hook)0x0) || (L->l_G->ravi_debugger_data == (void *)0x0)) {
    if ((func == (lua_Hook)0x0) || (G._4_4_ = mask, _count_local = func, mask == 0)) {
      G._4_4_ = 0;
      _count_local = (lua_Hook)0x0;
    }
    if ((L->ci->callstatus & 2) != 0) {
      L->oldpc = (L->ci->u).l.savedpc;
    }
    L->hook = _count_local;
    L->basehookcount = count;
    L->hookcount = L->basehookcount;
    L->hookmask = (lu_byte)G._4_4_;
  }
  return;
}

Assistant:

LUA_API void lua_sethook (lua_State *L, lua_Hook func, int mask, int count) {
  /* Ravi change - disable setting of hook if debugger is running the Lua instance */
  global_State *G = G(L);
  if (L->hook != NULL && G->ravi_debugger_data != NULL)
    return;
  if (func == NULL || mask == 0) {  /* turn off hooks? */
    mask = 0;
    func = NULL;
  }
  if (isLua(L->ci))
    L->oldpc = L->ci->u.l.savedpc;
  L->hook = func;
  L->basehookcount = count;
  resethookcount(L);
  L->hookmask = cast_byte(mask);
}